

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O3

void extent_dalloc_wrapper
               (tsdn_t *tsdn,arena_t *arena,extent_hooks_t **r_extent_hooks,extent_t *extent)

{
  extent_dalloc_t *peVar1;
  code *pcVar2;
  bool bVar3;
  _Bool _Var4;
  char cVar5;
  extent_hooks_t *peVar6;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 gdump_add;
  arena_t *paVar7;
  undefined1 in_R9B;
  ulong uVar8;
  void *addr;
  ulong uVar9;
  
  if ((*r_extent_hooks != &extent_hooks_default) || (!opt_retain)) {
    paVar7 = (arena_t *)extent;
    extent_deregister_impl(tsdn,extent,SUB81(r_extent_hooks,0));
    *(ushort *)&extent->e_addr = *(ushort *)&extent->e_addr & 0xf000;
    peVar6 = *r_extent_hooks;
    if (peVar6 == (extent_hooks_t *)0x0) {
      peVar6 = base_extent_hooks_get(arena->base);
      *r_extent_hooks = peVar6;
    }
    if (peVar6 == &extent_hooks_default) {
      addr = (void *)((ulong)extent->e_addr & 0xfffffffffffff000);
      uVar9 = (extent->field_2).e_size_esn;
      _Var4 = extent_in_dss(addr);
      gdump_add = extraout_DL_00;
      if (!_Var4) {
        bVar3 = extent_dalloc_mmap(addr,uVar9 & 0xfffffffffffff000);
        gdump_add = extraout_DL_01;
        goto joined_r0x0012c754;
      }
    }
    else {
      extent_hook_pre_reentrancy(tsdn,paVar7);
      peVar1 = (*r_extent_hooks)->dalloc;
      if (peVar1 == (extent_dalloc_t *)0x0) {
        extent_hook_post_reentrancy(tsdn);
        gdump_add = extraout_DL_02;
      }
      else {
        bVar3 = (*peVar1)(*r_extent_hooks,(void *)((ulong)extent->e_addr & 0xfffffffffffff000),
                          (extent->field_2).e_size_esn & 0xfffffffffffff000,
                          (_Bool)((byte)((uint)extent->e_bits >> 0xd) & 1),arena->base->ind);
        extent_hook_post_reentrancy(tsdn);
        gdump_add = extraout_DL;
joined_r0x0012c754:
        if (!bVar3) {
          extent_dalloc(tsdn,arena,extent);
          return;
        }
      }
    }
    paVar7 = (arena_t *)extent;
    extent_register_impl(tsdn,extent,(_Bool)gdump_add);
    if (*r_extent_hooks != &extent_hooks_default) {
      extent_hook_pre_reentrancy(tsdn,paVar7);
    }
  }
  uVar9 = 0x8000;
  if ((extent->e_bits & 0x2000) != 0) {
    uVar8 = (extent->field_2).e_size_esn & 0xfffffffffffff000;
    _Var4 = extent_decommit_wrapper(tsdn,arena,r_extent_hooks,extent,0,uVar8);
    in_R9B = (undefined1)uVar8;
    if (_Var4) {
      pcVar2 = (code *)(*r_extent_hooks)->purge_forced;
      if (pcVar2 != (code *)0x0) {
        uVar8 = (extent->field_2).e_size_esn & 0xfffffffffffff000;
        in_R9B = (undefined1)arena->base->ind;
        cVar5 = (*pcVar2)(*r_extent_hooks,(ulong)extent->e_addr & 0xfffffffffffff000,uVar8,0,uVar8);
        if (cVar5 == '\0') goto LAB_0012c844;
      }
      if ((extent->e_bits & 0x30000) == 0x20000) {
        uVar9 = 0;
      }
      else {
        peVar6 = *r_extent_hooks;
        if ((code *)peVar6->purge_lazy == (code *)0x0) {
          uVar9 = 0;
          goto LAB_0012c847;
        }
        uVar8 = (extent->field_2).e_size_esn & 0xfffffffffffff000;
        in_R9B = (undefined1)arena->base->ind;
        uVar9 = 0;
        (*(code *)peVar6->purge_lazy)
                  (peVar6,(ulong)extent->e_addr & 0xfffffffffffff000,uVar8,0,uVar8);
      }
    }
  }
LAB_0012c844:
  peVar6 = *r_extent_hooks;
LAB_0012c847:
  if (peVar6 != &extent_hooks_default) {
    extent_hook_post_reentrancy(tsdn);
  }
  extent->e_bits = extent->e_bits & 0xffffffffffff7fff | uVar9;
  extent_record(tsdn,arena,r_extent_hooks,&arena->extents_retained,extent,(_Bool)in_R9B);
  return;
}

Assistant:

void
extent_dalloc_wrapper(tsdn_t *tsdn, arena_t *arena,
    extent_hooks_t **r_extent_hooks, extent_t *extent) {
	assert(extent_dumpable_get(extent));
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	/* Avoid calling the default extent_dalloc unless have to. */
	if (*r_extent_hooks != &extent_hooks_default || extent_may_dalloc()) {
		/*
		 * Deregister first to avoid a race with other allocating
		 * threads, and reregister if deallocation fails.
		 */
		extent_deregister(tsdn, extent);
		if (!extent_dalloc_wrapper_try(tsdn, arena, r_extent_hooks,
		    extent)) {
			return;
		}
		extent_reregister(tsdn, extent);
	}

	if (*r_extent_hooks != &extent_hooks_default) {
		extent_hook_pre_reentrancy(tsdn, arena);
	}
	/* Try to decommit; purge if that fails. */
	bool zeroed;
	if (!extent_committed_get(extent)) {
		zeroed = true;
	} else if (!extent_decommit_wrapper(tsdn, arena, r_extent_hooks, extent,
	    0, extent_size_get(extent))) {
		zeroed = true;
	} else if ((*r_extent_hooks)->purge_forced != NULL &&
	    !(*r_extent_hooks)->purge_forced(*r_extent_hooks,
	    extent_base_get(extent), extent_size_get(extent), 0,
	    extent_size_get(extent), arena_ind_get(arena))) {
		zeroed = true;
	} else if (extent_state_get(extent) == extent_state_muzzy ||
	    ((*r_extent_hooks)->purge_lazy != NULL &&
	    !(*r_extent_hooks)->purge_lazy(*r_extent_hooks,
	    extent_base_get(extent), extent_size_get(extent), 0,
	    extent_size_get(extent), arena_ind_get(arena)))) {
		zeroed = false;
	} else {
		zeroed = false;
	}
	if (*r_extent_hooks != &extent_hooks_default) {
		extent_hook_post_reentrancy(tsdn);
	}
	extent_zeroed_set(extent, zeroed);

	if (config_prof) {
		extent_gdump_sub(tsdn, extent);
	}

	extent_record(tsdn, arena, r_extent_hooks, &arena->extents_retained,
	    extent, false);
}